

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeCasts.cpp
# Opt level: O2

void __thiscall
wasm::anon_unknown_168::EarlyCastFinder::flushRefAsResult
          (EarlyCastFinder *this,size_t index,Module *module)

{
  mapped_type pRVar1;
  key_type pLVar2;
  mapped_type *ppRVar3;
  pointer pRVar4;
  
  pRVar4 = (this->currRefAsMove).
           super__Vector_base<wasm::(anonymous_namespace)::RefAsInfo,_std::allocator<wasm::(anonymous_namespace)::RefAsInfo>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pRVar4[index].target != (LocalGet *)0x0) {
    pRVar4 = pRVar4 + index;
    if (pRVar4->bestCast != (RefAs *)0x0) {
      pLVar2 = (key_type)
               Properties::getFallthrough
                         ((Expression *)pRVar4->bestCast,&this->options,module,AllowTeeBrIf);
      if (pLVar2 != pRVar4->target) {
        pRVar1 = pRVar4->bestCast;
        ppRVar3 = std::__detail::
                  _Map_base<wasm::LocalGet_*,_std::pair<wasm::LocalGet_*const,_wasm::RefAs_*>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::RefAs_*>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<wasm::LocalGet_*,_std::pair<wasm::LocalGet_*const,_wasm::RefAs_*>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::RefAs_*>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)&this->refAsToApply,&pRVar4->target);
        *ppRVar3 = pRVar1;
      }
      pRVar4->bestCast = (RefAs *)0x0;
    }
    pRVar4->target = (key_type)0x0;
  }
  return;
}

Assistant:

void flushRefAsResult(size_t index, Module& module) {
    auto& target = currRefAsMove[index].target;
    if (target) {
      auto& bestCast = currRefAsMove[index].bestCast;
      if (bestCast) {
        // As in flushRefCastResult, we need to check if the cast is already at
        // the target and thus does not need to be moved.
        auto* fallthrough =
          Properties::getFallthrough(bestCast, options, module);
        if (fallthrough != target) {
          refAsToApply[target] = bestCast;
        }
        bestCast = nullptr;
      }
      target = nullptr;
    }
  }